

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

bool __thiscall
QSortFilterProxyModel::insertRows(QSortFilterProxyModel *this,int row,int count,QModelIndex *parent)

{
  Mapping *this_00;
  bool bVar1;
  int iVar2;
  Mapping **ppMVar3;
  long lVar4;
  qsizetype qVar5;
  const_reference piVar6;
  arrow_operator_result ppQVar7;
  QModelIndex *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int source_row;
  Mapping *m;
  QSortFilterProxyModelPrivate *d;
  QModelIndex source_parent;
  qsizetype in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  ulong local_88;
  bool local_31;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSortFilterProxyModel *)0x8777bd);
  if ((in_ESI < 0) || ((int)in_EDX < 1)) {
    local_31 = false;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 400))(&local_20,in_RDI,in_RCX);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70))
    ;
    if ((!bVar1) ||
       (bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)), bVar1)) {
      QSortFilterProxyModelPrivate::create_mapping
                ((QSortFilterProxyModelPrivate *)CONCAT44(in_ESI,in_EDX),in_RCX);
      ppMVar3 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                const_iterator::value((const_iterator *)0x877867);
      this_00 = *ppMVar3;
      lVar4 = (long)in_ESI;
      qVar5 = QList<int>::size(&this_00->source_rows);
      if (qVar5 < lVar4) {
        local_31 = false;
      }
      else {
        qVar5 = QList<int>::size(&this_00->source_rows);
        if (in_ESI < qVar5) {
          piVar6 = QList<int>::at((QList<int> *)
                                  CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff68);
          local_88 = (ulong)*piVar6;
        }
        else {
          local_88 = QList<int>::size(&this_00->proxy_rows);
        }
        ppQVar7 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
        iVar2 = (*((*ppQVar7)->super_QObject)._vptr_QObject[0x1f])
                          (*ppQVar7,local_88 & 0xffffffff,(ulong)in_EDX,&local_20);
        local_31 = (bool)((byte)iVar2 & 1);
      }
    }
    else {
      local_31 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool QSortFilterProxyModel::insertRows(int row, int count, const QModelIndex &parent)
{
    Q_D(QSortFilterProxyModel);
    if (row < 0 || count <= 0)
        return false;
    QModelIndex source_parent = mapToSource(parent);
    if (parent.isValid() && !source_parent.isValid())
        return false;
    QSortFilterProxyModelPrivate::Mapping *m = d->create_mapping(source_parent).value();
    if (row > m->source_rows.size())
        return false;
    int source_row = (row >= m->source_rows.size()
                      ? m->proxy_rows.size()
                      : m->source_rows.at(row));
    return d->model->insertRows(source_row, count, source_parent);
}